

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

opStatus __thiscall
llvm::detail::DoubleAPFloat::convertFromZeroExtendedInteger
          (DoubleAPFloat *this,integerPart *Input,uint InputSize,bool IsSigned,roundingMode RM)

{
  opStatus oVar1;
  undefined1 local_70 [36];
  opStatus local_4c;
  undefined1 local_48 [4];
  opStatus Ret;
  APFloat Tmp;
  roundingMode RM_local;
  bool IsSigned_local;
  uint InputSize_local;
  integerPart *Input_local;
  DoubleAPFloat *this_local;
  
  Tmp.U._20_4_ = RM;
  if (this->Semantics != (fltSemantics *)semPPCDoubleDouble) {
    __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x10ed,
                  "APFloat::opStatus llvm::detail::DoubleAPFloat::convertFromZeroExtendedInteger(const integerPart *, unsigned int, bool, roundingMode)"
                 );
  }
  APFloat::APFloat((APFloat *)local_48,(fltSemantics *)semPPCDoubleDoubleLegacy);
  local_4c = APFloat::convertFromZeroExtendedInteger
                       ((APFloat *)local_48,Input,InputSize,IsSigned,Tmp.U._20_4_);
  APFloat::bitcastToAPInt((APFloat *)local_70);
  DoubleAPFloat((DoubleAPFloat *)(local_70 + 0x10),(fltSemantics *)semPPCDoubleDouble,
                (APInt *)local_70);
  operator=(this,(DoubleAPFloat *)(local_70 + 0x10));
  ~DoubleAPFloat((DoubleAPFloat *)(local_70 + 0x10));
  APInt::~APInt((APInt *)local_70);
  oVar1 = local_4c;
  APFloat::~APFloat((APFloat *)local_48);
  return oVar1;
}

Assistant:

APFloat::opStatus
DoubleAPFloat::convertFromZeroExtendedInteger(const integerPart *Input,
                                              unsigned int InputSize,
                                              bool IsSigned, roundingMode RM) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  APFloat Tmp(semPPCDoubleDoubleLegacy);
  auto Ret = Tmp.convertFromZeroExtendedInteger(Input, InputSize, IsSigned, RM);
  *this = DoubleAPFloat(semPPCDoubleDouble, Tmp.bitcastToAPInt());
  return Ret;
}